

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Assimp::FBX::FBXConverter::ConvertMesh
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          FBXConverter *this,MeshGeometry *mesh,Model *model,aiMatrix4x4 *node_global_transform,
          aiNode *nd)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  uint uVar4;
  iterator iVar5;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar7;
  MatIndexArray *pMVar8;
  int *piVar9;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1e8;
  aiNode *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  format local_1a8;
  
  local_1e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d0 = nd;
  local_1a8._0_8_ = mesh;
  iVar5 = std::
          _Rb_tree<const_Assimp::FBX::Geometry_*,_std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<const_Assimp::FBX::Geometry_*>,_std::allocator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
          ::find(&(this->meshes_converted)._M_t,(key_type *)&local_1a8);
  if ((_Rb_tree_header *)iVar5._M_node ==
      &(this->meshes_converted)._M_t._M_impl.super__Rb_tree_header) {
    pvVar6 = MeshGeometry::GetVertices(mesh);
    pvVar7 = MeshGeometry::GetFaceIndexCounts(mesh);
    if (((pvVar6->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_start ==
         (pvVar6->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish) ||
       ((pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish)) {
      std::operator+(&local_1c8,"ignoring empty geometry: ",
                     &(mesh->super_Geometry).super_Object.name);
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_1a8,
                 &local_1c8);
      LogFunctions<Assimp::FBXImporter>::LogWarn(&local_1a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    else {
      pMVar8 = MeshGeometry::GetMaterialIndices(mesh);
      if (this->doc->settings->readMaterials == true) {
        piVar2 = (pMVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3 = (pMVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if (piVar2 != piVar3) {
          piVar9 = piVar2;
          do {
            if (piVar9 == piVar3) goto LAB_0050093f;
            iVar1 = *piVar9;
            piVar9 = piVar9 + 1;
          } while (iVar1 == *piVar2);
          ConvertMeshMultiMaterial
                    (__return_storage_ptr__,this,mesh,model,node_global_transform,local_1d0);
          goto LAB_00500981;
        }
      }
LAB_0050093f:
      uVar4 = ConvertMeshSingleMaterial(this,mesh,model,node_global_transform,local_1d0);
      local_1a8._0_4_ = uVar4;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1e8,
                 (uint *)&local_1a8);
    }
  }
  else {
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_int_const*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (&(iVar5._M_node[1]._M_parent)->_M_color,&(iVar5._M_node[1]._M_left)->_M_color,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1e8);
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = local_1e8._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = local_1e8._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1e8._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_00500981:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1e8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned int> FBXConverter::ConvertMesh(const MeshGeometry& mesh, const Model& model,
            const aiMatrix4x4& node_global_transform, aiNode& nd)
        {
            std::vector<unsigned int> temp;

            MeshMap::const_iterator it = meshes_converted.find(&mesh);
            if (it != meshes_converted.end()) {
                std::copy((*it).second.begin(), (*it).second.end(), std::back_inserter(temp));
                return temp;
            }

            const std::vector<aiVector3D>& vertices = mesh.GetVertices();
            const std::vector<unsigned int>& faces = mesh.GetFaceIndexCounts();
            if (vertices.empty() || faces.empty()) {
                FBXImporter::LogWarn("ignoring empty geometry: " + mesh.Name());
                return temp;
            }

            // one material per mesh maps easily to aiMesh. Multiple material
            // meshes need to be split.
            const MatIndexArray& mindices = mesh.GetMaterialIndices();
            if (doc.Settings().readMaterials && !mindices.empty()) {
                const MatIndexArray::value_type base = mindices[0];
                for (MatIndexArray::value_type index : mindices) {
                    if (index != base) {
                        return ConvertMeshMultiMaterial(mesh, model, node_global_transform, nd);
                    }
                }
            }

            // faster code-path, just copy the data
            temp.push_back(ConvertMeshSingleMaterial(mesh, model, node_global_transform, nd));
            return temp;
        }